

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

ForNonStreamable<InitList,_std::string> *
lest::make_string<InitList>
          (ForNonStreamable<InitList,_std::string> *__return_storage_ptr__,InitList *item)

{
  InitList *item_local;
  
  make_enum_string<InitList>(__return_storage_ptr__,item);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( T const & item ) -> ForNonStreamable<T, std::string>
{
    return make_enum_string( item );
}